

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction_util.cpp
# Opt level: O1

CMutableTransaction *
ConstructTransaction
          (CMutableTransaction *__return_storage_ptr__,UniValue *inputs_in,UniValue *outputs_in,
          UniValue *locktime,optional<bool> rbf)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  UniValue *pUVar4;
  long in_FS_OFFSET;
  string local_d0;
  undefined1 local_b0 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> local_98 [4];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(__return_storage_ptr__);
  if (locktime->typ != VNULL) {
    uVar3 = UniValue::getInt<long>(locktime);
    if (uVar3 >> 0x20 != 0) {
      pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
      local_b0._0_8_ = local_b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b0,"Invalid parameter, locktime out of range","");
      JSONRPCError(pUVar4,-8,(string *)local_b0);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(pUVar4,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_0037ac42;
    }
    __return_storage_ptr__->nLockTime = (uint32_t)uVar3;
  }
  AddInputs(__return_storage_ptr__,inputs_in,rbf);
  AddOutputs(__return_storage_ptr__,outputs_in);
  if (((((ushort)rbf.super__Optional_base<bool,_true,_true>._M_payload.
                 super__Optional_payload_base<bool> & 0x100) == 0) ||
      (((ushort)rbf.super__Optional_base<bool,_true,_true>._M_payload.
                super__Optional_payload_base<bool> & 1) == 0)) ||
     ((__return_storage_ptr__->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (__return_storage_ptr__->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    bVar1 = false;
    bVar2 = false;
  }
  else {
    CTransaction::CTransaction((CTransaction *)local_b0,__return_storage_ptr__);
    bVar2 = SignalsOptInRBF((CTransaction *)local_b0);
    bVar2 = !bVar2;
    bVar1 = true;
  }
  if (bVar1) {
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(local_98);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_b0);
  }
  if (bVar2) {
    pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,
               "Invalid parameter combination: Sequence number(s) contradict replaceable option","")
    ;
    JSONRPCError(pUVar4,-8,&local_d0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      __cxa_throw(pUVar4,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_0037ac42:
  __stack_chk_fail();
}

Assistant:

CMutableTransaction ConstructTransaction(const UniValue& inputs_in, const UniValue& outputs_in, const UniValue& locktime, std::optional<bool> rbf)
{
    CMutableTransaction rawTx;

    if (!locktime.isNull()) {
        int64_t nLockTime = locktime.getInt<int64_t>();
        if (nLockTime < 0 || nLockTime > LOCKTIME_MAX)
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, locktime out of range");
        rawTx.nLockTime = nLockTime;
    }

    AddInputs(rawTx, inputs_in, rbf);
    AddOutputs(rawTx, outputs_in);

    if (rbf.has_value() && rbf.value() && rawTx.vin.size() > 0 && !SignalsOptInRBF(CTransaction(rawTx))) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter combination: Sequence number(s) contradict replaceable option");
    }

    return rawTx;
}